

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O3

void __thiscall BitString::SetValue(BitString *this,uchar unusedBits,uchar *data,size_t cb)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  pointer puVar1;
  invalid_argument *this_01;
  
  if (unusedBits < 8) {
    this_00 = &this->value;
    puVar1 = (this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,cb + 1);
    *(this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
     super__Vector_impl_data._M_start = unusedBits;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,
               (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start + 1,data,data + cb);
    return;
  }
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_01,"Too many unused bits");
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void BitString::SetValue(unsigned char unusedBits, const unsigned char * data, size_t cb)
{
	// Behavior here is interesting - first char specifies how many trailing
	// bits aren't used

	if (unusedBits > 7)
		throw std::invalid_argument("Too many unused bits");

	value.clear();
	value.resize(cb + 1);
	value[0] = unusedBits;
	value.insert(value.begin() + 1, data, data + cb);
}